

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleDynamicsWorld.cpp
# Opt level: O1

void __thiscall btSimpleDynamicsWorld::setGravity(btSimpleDynamicsWorld *this,btVector3 *gravity)

{
  btRigidBody *this_00;
  undefined8 uVar1;
  long lVar2;
  
  uVar1 = *(undefined8 *)(gravity->m_floats + 2);
  *(undefined8 *)(this->m_gravity).m_floats = *(undefined8 *)gravity->m_floats;
  *(undefined8 *)((this->m_gravity).m_floats + 2) = uVar1;
  if (0 < (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_size) {
    lVar2 = 0;
    do {
      this_00 = (btRigidBody *)
                (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_data
                [lVar2];
      if ((this_00 != (btRigidBody *)0x0) &&
         (((this_00->super_btCollisionObject).m_internalType & 2U) != 0)) {
        btRigidBody::setGravity(this_00,gravity);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < (this->super_btDynamicsWorld).super_btCollisionWorld.m_collisionObjects.m_size)
    ;
  }
  return;
}

Assistant:

void	btSimpleDynamicsWorld::setGravity(const btVector3& gravity)
{
	m_gravity = gravity;
	for ( int i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		btRigidBody* body = btRigidBody::upcast(colObj);
		if (body)
		{
			body->setGravity(gravity);
		}
	}
}